

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfsCiMap(Gia_Man_t *p,int *pCi2Lit,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iLitRes;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vLits_local;
  int *pCi2Lit_local;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iLitRes = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (iLitRes < iVar1) {
      _iLit = Gia_ManCi(p,iLitRes);
      bVar6 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iLit->Value = uVar2;
    if (pCi2Lit[iLitRes] != -1) {
      iVar1 = Abc_Lit2Var(pCi2Lit[iLitRes]);
      pGVar5 = Gia_ManObj(p,iVar1);
      uVar2 = pGVar5->Value;
      iVar1 = Abc_LitIsCompl(pCi2Lit[iLitRes]);
      uVar2 = Abc_LitNotCond(uVar2,iVar1);
      _iLit->Value = uVar2;
    }
    iLitRes = iLitRes + 1;
  }
  Gia_ManHashAlloc(p_00);
  if (vLits == (Vec_Int_t *)0x0) {
    iLitRes = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (iLitRes < iVar1) {
        _iLit = Gia_ManCo(p,iLitRes);
        bVar6 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pGVar5 = Gia_ObjFanin0(_iLit);
      Gia_ManDupDfs2_rec(p_00,p,pGVar5);
      iVar1 = Gia_ObjFanin0Copy(_iLit);
      Gia_ManAppendCo(p_00,iVar1);
      iLitRes = iLitRes + 1;
    }
  }
  else {
    for (iLitRes = 0; iVar1 = Vec_IntSize(vLits), iLitRes < iVar1; iLitRes = iLitRes + 1) {
      iVar1 = Vec_IntEntry(vLits,iLitRes);
      iVar3 = Abc_Lit2Var(iVar1);
      pGVar5 = Gia_ManObj(p,iVar3);
      iVar3 = Gia_ManDupDfs2_rec(p_00,p,pGVar5);
      iVar1 = Abc_LitIsCompl(iVar1);
      iVar1 = Abc_LitNotCond(iVar3,iVar1);
      Gia_ManAppendCo(p_00,iVar1);
    }
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsCiMap( Gia_Man_t * p, int * pCi2Lit, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( ~pCi2Lit[i] )
            pObj->Value = Abc_LitNotCond( Gia_ManObj(p, Abc_Lit2Var(pCi2Lit[i]))->Value, Abc_LitIsCompl(pCi2Lit[i]) );
    }
    Gia_ManHashAlloc( pNew );
    if ( vLits )
    {
        int iLit, iLitRes;
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
            Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
        }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManDupDfs2_rec( pNew, p, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}